

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int received_get_section_number(RECEIVED_HANDLE received,uint32_t *section_number_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint32_t local_1c;
  
  if (received == (RECEIVED_HANDLE)0x0) {
    iVar3 = 0x43cd;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(received->composite_value,&local_1c);
    iVar3 = 0x43d5;
    if (iVar1 == 0) {
      if (local_1c == 0) {
        iVar3 = 0x43db;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(received->composite_value,0);
        iVar3 = 0x43e3;
        if ((value != (AMQP_VALUE)0x0) &&
           (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
          iVar1 = amqpvalue_get_uint(value,section_number_value);
          iVar3 = 0x43ea;
          if (iVar1 == 0) {
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int received_get_section_number(RECEIVED_HANDLE received, uint32_t* section_number_value)
{
    int result;

    if (received == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)received;
        if (amqpvalue_get_composite_item_count(received_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(received_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_uint(item_value, section_number_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}